

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTrivial(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Type type_00;
  Type local_58;
  Expression *local_50;
  Expression *ret;
  TranslateToFuzzReader *local_40;
  BasicType local_34;
  TranslateToFuzzReader *local_30;
  TranslateToFuzzReader *local_28;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::isConcrete((Type *)&this_local);
  if (bVar1) {
    bVar1 = oneIn(this,2);
    if ((bVar1) && (this->funcContext != (FunctionCreationContext *)0x0)) {
      local_28 = this_local;
      type_local.id = (uintptr_t)makeLocalGet(this,(Type)this_local);
    }
    else {
      local_30 = this_local;
      type_local.id = (uintptr_t)makeConst(this,(Type)this_local);
    }
  }
  else {
    local_34 = none;
    bVar1 = Type::operator==((Type *)&this_local,&local_34);
    if (bVar1) {
      local_40 = this_local;
      type_local.id = (uintptr_t)makeNop(this,(Type)this_local);
    }
    else {
      ret._4_4_ = 1;
      bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&ret + 4));
      if (!bVar1) {
        __assert_fail("type == Type::unreachable",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0x4b2,"Expression *wasm::TranslateToFuzzReader::makeTrivial(Type)");
      }
      local_50 = (Expression *)0x0;
      local_58 = Function::getResults(this->funcContext->func);
      bVar1 = Type::isConcrete(&local_58);
      if (bVar1) {
        type_00 = Function::getResults(this->funcContext->func);
        local_50 = makeTrivial(this,type_00);
      }
      type_local.id = (uintptr_t)Builder::makeReturn(&this->builder,local_50);
    }
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeTrivial(Type type) {
  if (type.isConcrete()) {
    if (oneIn(2) && funcContext) {
      return makeLocalGet(type);
    } else {
      return makeConst(type);
    }
  } else if (type == Type::none) {
    return makeNop(type);
  }
  assert(type == Type::unreachable);
  Expression* ret = nullptr;
  if (funcContext->func->getResults().isConcrete()) {
    ret = makeTrivial(funcContext->func->getResults());
  }
  return builder.makeReturn(ret);
}